

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O2

void __thiscall
Memory::InlineCacheAllocator::ClearCacheIfHasDeadWeakRefs
          (InlineCacheAllocator *this,Recycler *recycler,CacheLayout *cache)

{
  ulong uVar1;
  bool bVar2;
  intptr_t *curWeakRefPtr;
  CacheLayout *pCVar3;
  
  pCVar3 = cache;
  while( true ) {
    if (&cache->strongRef <= pCVar3) {
      return;
    }
    uVar1 = pCVar3->weakRefs[0];
    if (((uVar1 & 0xb) == 0 && uVar1 != 0) &&
       (bVar2 = HeapBlockMap64::IsMarked
                          (&recycler->heapBlockMap,(void *)(uVar1 & 0xfffffffffffffff0)), !bVar2))
    break;
    pCVar3 = (CacheLayout *)(pCVar3->weakRefs + 1);
  }
  cache->weakRefs[0] = 0;
  cache->weakRefs[1] = 0;
  cache->weakRefs[2] = 0;
  return;
}

Assistant:

void InlineCacheAllocator::ClearCacheIfHasDeadWeakRefs(Recycler* recycler, CacheLayout* cache)
{
    for (intptr_t* curWeakRefPtr = cache->weakRefs; curWeakRefPtr < &cache->strongRef; curWeakRefPtr++)
    {
        intptr_t curWeakRef = *curWeakRefPtr;

        if (curWeakRef == 0)
        {
            continue;
        }

        curWeakRef &= ~(intptr_t)InlineCacheAuxSlotTypeTag;

        if ((curWeakRef & (HeapConstants::ObjectGranularity - 1)) != 0)
        {
            continue;
        }

        if (!recycler->IsObjectMarked((void*)curWeakRef))
        {
            cache->weakRefs[0] = 0;
            cache->weakRefs[1] = 0;
            cache->weakRefs[2] = 0;
            break;
        }
    }
}